

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O1

QDomNodePrivate * __thiscall
QDomDocumentTypePrivate::replaceChild
          (QDomDocumentTypePrivate *this,QDomNodePrivate *newChild,QDomNodePrivate *oldChild)

{
  int iVar1;
  QDomNamedNodeMapPrivate *pQVar2;
  long in_FS_OFFSET;
  QDomNodePrivate *p;
  iterator local_50;
  QString local_38;
  QDomNodePrivate *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = QDomNodePrivate::replaceChild(&this->super_QDomNodePrivate,newChild,oldChild);
  if (local_20 == (QDomNodePrivate *)0x0) goto LAB_00111760;
  if (oldChild != (QDomNodePrivate *)0x0) {
    iVar1 = (*oldChild->_vptr_QDomNodePrivate[0xb])(oldChild);
    if (iVar1 == 6) {
      pQVar2 = this->entities;
    }
    else {
      iVar1 = (*oldChild->_vptr_QDomNodePrivate[0xb])(oldChild);
      if (iVar1 != 0xc) goto LAB_001116cc;
      pQVar2 = this->notations;
    }
    local_38.d.d = (oldChild->name).d.d;
    local_38.d.ptr = (oldChild->name).d.ptr;
    local_38.d.size = (oldChild->name).d.size;
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_38.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_38.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QMultiHash<QString,_QDomNodePrivate_*>::removeImpl<QString>(&pQVar2->map,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
LAB_001116cc:
  iVar1 = (*local_20->_vptr_QDomNodePrivate[0xb])();
  if (iVar1 == 6) {
    pQVar2 = this->entities;
  }
  else {
    iVar1 = (*local_20->_vptr_QDomNodePrivate[0xb])();
    if (iVar1 != 0xc) goto LAB_00111760;
    pQVar2 = this->notations;
  }
  local_38.d.d = (local_20->name).d.d;
  local_38.d.ptr = (local_20->name).d.ptr;
  local_38.d.size = (local_20->name).d.size;
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_38.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_38.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QMultiHash<QString,QDomNodePrivate*>::emplace<QDomNodePrivate*const&>
            (&local_50,&pQVar2->map,&local_38,&local_20);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00111760:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

QDomNodePrivate* QDomDocumentTypePrivate::replaceChild(QDomNodePrivate* newChild, QDomNodePrivate* oldChild)
{
    // Call the original implementation
    QDomNodePrivate* p = QDomNodePrivate::replaceChild(newChild, oldChild);
    // Update the maps
    if (p) {
        if (oldChild && oldChild->isEntity())
            entities->map.remove(oldChild->nodeName());
        else if (oldChild && oldChild->isNotation())
            notations->map.remove(oldChild->nodeName());

        if (p->isEntity())
            entities->map.insert(p->nodeName(), p);
        else if (p->isNotation())
            notations->map.insert(p->nodeName(), p);
    }

    return p;
}